

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

void __thiscall Process::~Process(Process *this)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((this->mReturn == -2) && (this->mPid != -1)) {
    __assert_fail("mReturn != ReturnUnset || mPid == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x10f,"Process::~Process()");
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  if (this->mStdIn[0] == -1) {
    bVar4 = false;
  }
  else {
    EventLoop::eventLoop();
    bVar4 = local_28 != 0;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  if (bVar4) {
    handleInput(this,this->mStdIn[1]);
  }
  closeStdIn(this,CloseForce);
  closeStdOut(this);
  closeStdErr(this);
  if (this->mSync[0] != -1) {
    do {
      iVar2 = close(this->mSync[0]);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  if (this->mSync[1] != -1) {
    do {
      iVar2 = close(this->mSync[1]);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  pcVar1 = (this->mErrorString).mString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mErrorString).mString.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mChRoot).super_String.mString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mChRoot).super_String.mString.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mCwd).super_String.mString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mCwd).super_String.mString.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mStdErrBuffer).mString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mStdErrBuffer).mString.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mStdOutBuffer).mString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mStdOutBuffer).mString.field_2) {
    operator_delete(pcVar1);
  }
  std::deque<String,_std::allocator<String>_>::~deque(&this->mStdInBuffer);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>_>
  ::~_Rb_tree(&(this->mFinished).connections._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>_>
  ::~_Rb_tree(&(this->mReadyReadStdErr).connections._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>_>
  ::~_Rb_tree(&(this->mReadyReadStdOut).connections._M_t);
  return;
}

Assistant:

Process::~Process()
{
    {
        std::lock_guard<std::mutex> lock(mMutex);
        assert(mReturn != ReturnUnset || mPid == -1);
    }

    if (mStdIn[0] != -1 && EventLoop::eventLoop()) {
        // try to finish off any pending writes
        handleInput(mStdIn[1]);
    }

    closeStdIn(CloseForce);
    closeStdOut();
    closeStdErr();

    int w;
    if (mSync[0] != -1)
        eintrwrap(w, ::close(mSync[0]));
    if (mSync[1] != -1)
        eintrwrap(w, ::close(mSync[1]));
}